

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

string * __thiscall
cmFileAPI::ObjectName_abi_cxx11_(string *__return_storage_ptr__,cmFileAPI *this,Object *o)

{
  char *str;
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  undefined1 local_19;
  cmFileAPI *local_18;
  Object *o_local;
  string *name;
  
  local_19 = 0;
  local_18 = this;
  o_local = (Object *)__return_storage_ptr__;
  str = ObjectKindName(*(ObjectKind *)&this->CMakeInstance);
  cmAlphaNum::cmAlphaNum(&local_50,str);
  cmAlphaNum::cmAlphaNum(&local_80,"-v");
  cmStrCat<unsigned_long>
            (__return_storage_ptr__,&local_50,&local_80,(unsigned_long *)&local_18->APIv1);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFileAPI::ObjectName(Object const& o)
{
  std::string name = cmStrCat(ObjectKindName(o.Kind), "-v", o.Version);
  return name;
}